

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ini.c
# Opt level: O0

int sx_ini_property_count(sx_ini *ini,int section)

{
  int iVar1;
  int section_local;
  sx_ini *ini_local;
  
  iVar1 = ini_property_count(ini,section);
  return iVar1;
}

Assistant:

int sx_ini_property_count(sx_ini const* ini, int section)
{
    return ini_property_count(ini, section);
}